

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::ToolBarLayout::setRightArrow(ToolBarLayout *this,NavigationArrow *a)

{
  QWidgetItem *pQVar1;
  
  if (this->right != (QWidgetItem *)0x0) {
    (**(code **)(*(long *)this->right + 8))();
  }
  pQVar1 = (QWidgetItem *)operator_new(0x18);
  *(undefined4 *)(pQVar1 + 8) = 0;
  *(code **)pQVar1 = QWidget::update;
  *(NavigationArrow **)(pQVar1 + 0x10) = a;
  this->right = pQVar1;
  return;
}

Assistant:

void
ToolBarLayout::setRightArrow( NavigationArrow * a )
{
	if( right )
		delete right;

	right = new QWidgetItem( a );
}